

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<char[67],std::__cxx11::string,char[93],std::__cxx11::string,char[19],std::__cxx11::string,char[14],std::__cxx11::string,char[19],std::__cxx11::string,char[13]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [67],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [93],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
                   char (*args_4) [19],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,
                   char (*args_6) [14],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_7,
                   char (*args_8) [19],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_9,
                   char (*args_10) [13])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  size_t local_f0;
  char *pcStack_e8;
  size_t local_e0;
  char (*local_d8) [67];
  size_type local_d0;
  pointer local_c8;
  size_t local_c0;
  char (*local_b8) [93];
  size_type local_b0;
  pointer local_a8;
  size_t local_a0;
  char (*local_98) [19];
  size_type local_90;
  pointer local_88;
  size_t local_80;
  char (*local_78) [14];
  size_type local_70;
  pointer local_68;
  size_t local_60;
  char (*local_58) [19];
  size_type local_50;
  pointer local_48;
  size_t local_40;
  char (*local_38) [13];
  
  local_100._M_len = (a->View_)._M_len;
  local_100._M_str = (a->View_)._M_str;
  local_f0 = (b->View_)._M_len;
  pcStack_e8 = (b->View_)._M_str;
  local_e0 = strlen(*args);
  local_c8 = (args_1->_M_dataplus)._M_p;
  local_d0 = args_1->_M_string_length;
  local_d8 = args;
  local_c0 = strlen(*args_2);
  local_a8 = (args_3->_M_dataplus)._M_p;
  local_b0 = args_3->_M_string_length;
  local_b8 = args_2;
  local_a0 = strlen(*args_4);
  local_98 = args_4;
  local_88 = (args_5->_M_dataplus)._M_p;
  local_90 = args_5->_M_string_length;
  local_80 = strlen(*args_6);
  local_78 = args_6;
  local_68 = (args_7->_M_dataplus)._M_p;
  local_70 = args_7->_M_string_length;
  local_60 = strlen(*args_8);
  local_58 = args_8;
  local_48 = (args_9->_M_dataplus)._M_p;
  local_50 = args_9->_M_string_length;
  local_40 = strlen(*args_10);
  local_38 = args_10;
  views._M_len = 0xd;
  views._M_array = &local_100;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}